

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_mel_cepstral_analysis.h
# Opt level: O2

void __thiscall sptk::SecondOrderAllPassMelCepstralAnalysis::Buffer::Buffer(Buffer *this)

{
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_0011a660;
  memset(&this->log_periodogram_,0,0xf0);
  (this->buffer_for_fourier_transform_)._vptr_Buffer = (_func_int **)&PTR__Buffer_0011a630;
  (this->buffer_for_fourier_transform_).real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_fourier_transform_).real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_fourier_transform_).real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buffer_for_fourier_transform_).imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_fourier_transform_).imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_fourier_transform_).imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_)._vptr_Buffer = (_func_int **)&PTR__Buffer_0011a690;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_._vptr_Buffer =
       (_func_int **)&PTR__Buffer_0011a630;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.real_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->buffer_for_inverse_fourier_transform_).fast_fourier_transform_buffer_.imag_part_input_.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ToeplitzPlusHankelSystemSolver::Buffer::Buffer(&this->buffer_for_system_solver_);
  return;
}

Assistant:

Buffer() {
    }